

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

void Js::JavascriptOperators::PatchSetPropertyScoped<false,Js::InlineCache>
               (FunctionBody *functionBody,InlineCache *inlineCache,
               InlineCacheIndex inlineCacheIndex,FrameDisplay *pDisplay,PropertyId propertyId,
               Var newValue,Var defaultInstance,PropertyOperationFlags propertyOperationFlags)

{
  DisableImplicitFlags DVar1;
  ushort uVar2;
  code *pcVar3;
  ScriptContext *pSVar4;
  undefined4 *puVar5;
  bool bVar6;
  BOOL BVar7;
  DescriptorFlags DVar8;
  void *pvVar9;
  RecyclableObject *pRVar10;
  GlobalObject *instance;
  PropertyRecord *pPVar11;
  uint index;
  int iVar12;
  bool bVar13;
  undefined1 local_120 [8];
  PropertyValueInfo info;
  PropertyValueInfo info2;
  UndeclaredBlockVariable *local_98;
  Var value;
  Type *local_88;
  FunctionBody *local_80;
  ulong local_78;
  InlineCache *local_70;
  uint local_68;
  int local_64;
  ScriptContext *local_60;
  FrameDisplay *local_58;
  InlineCacheIndex local_4c;
  uint local_48;
  uint local_44;
  undefined4 *local_40;
  PropertyOperationFlags local_34;
  
  local_4c = inlineCacheIndex;
  local_60 = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  uVar2 = pDisplay->length;
  local_120 = (undefined1  [8])0x0;
  info.m_instance = (RecyclableObject *)0x50000ffff;
  info.m_propertyIndex = 0;
  info.m_attributes = '\0';
  info.flags = InlineCacheNoFlags;
  info.cacheInfoFlag = 0;
  info.inlineCache = (InlineCache *)0x0;
  info.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  info.functionBody = (FunctionBody *)0x0;
  info.prop = (RecyclableObject *)0x0;
  info.propertyRecordUsageCache._0_4_ = 0xffffffff;
  info.propertyRecordUsageCache._5_1_ = 1;
  local_80 = functionBody;
  local_70 = inlineCache;
  local_58 = pDisplay;
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)local_120,functionBody,inlineCache,local_4c,true);
  local_34 = propertyOperationFlags & PropertyOperation_AllowUndeclInConsoleScope;
  local_48 = uVar2 - 1;
  local_40 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  local_64 = -(uint)uVar2;
  index = 0;
  value = newValue;
  local_78 = (ulong)uVar2;
  local_44 = propertyId;
  while (pSVar4 = local_60, iVar12 = local_64 + index, iVar12 != 0) {
    local_68 = index;
    pvVar9 = FrameDisplay::GetItem(local_58,index);
    pRVar10 = UnsafeVarTo<Js::RecyclableObject>(pvVar9);
    bVar6 = VarIsImpl<Js::ConsoleScopeActivationObject>(pRVar10);
    if ((bVar6) && (iVar12 != -1)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = local_40;
      *local_40 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0xc73,
                                  "(!VarIs<ConsoleScopeActivationObject>(object) || (i == length - 1))"
                                  ,"Invalid location for ConsoleScopeActivationObject");
      if (!bVar6) goto LAB_009b7b93;
      *puVar5 = 0;
    }
    pSVar4 = local_60;
    local_88 = (pRVar10->type).ptr;
    bVar6 = CacheOperators::TrySetProperty<true,true,true,true,true,true,false,false>
                      (pRVar10,false,propertyId,newValue,local_60,propertyOperationFlags,
                       (PropertyCacheOperationInfo *)0x0,(PropertyValueInfo *)local_120);
    newValue = value;
    if (bVar6) {
      return;
    }
    bVar6 = SetAccessorOrNonWritableProperty
                      (pRVar10,pRVar10,propertyId,value,(PropertyValueInfo *)local_120,pSVar4,
                       propertyOperationFlags,false,local_34 != PropertyOperation_None,
                       (BOOL *)&info2.isFunctionPIC);
    if (bVar6) {
      return;
    }
    BVar7 = IsObject(pRVar10);
    if (BVar7 == 0) {
      JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags,local_60);
    }
    propertyId = local_44;
    BVar7 = HasProperty(pRVar10,local_44);
    pSVar4 = local_60;
    if (BVar7 != 0) {
      DVar1 = local_60->threadContext->disableImplicitFlags;
      local_60->threadContext->disableImplicitFlags = DisableImplicitCallAndExceptionFlag;
      BVar7 = GetProperty(pRVar10,propertyId,&local_98,local_60,(PropertyValueInfo *)0x0);
      pSVar4->threadContext->disableImplicitFlags = DVar1;
      if ((((BVar7 != 0) && (propertyId != 0x2d5)) && (local_34 == PropertyOperation_None)) &&
         ((((pSVar4->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr ==
          local_98)) {
        JavascriptError::ThrowReferenceError(pSVar4,-0x7ff5ec07,(PCWSTR)0x0);
      }
      info.inlineCacheIndex = 0;
      info.isFunctionPIC = false;
      info.allowResizingPolymorphicInlineCache = false;
      info._62_2_ = 0;
      info2.m_instance = (RecyclableObject *)0x50000ffff;
      info2.m_propertyIndex = 0;
      info2.m_attributes = '\0';
      info2.flags = InlineCacheNoFlags;
      info2.cacheInfoFlag = 0;
      info2.inlineCache = (InlineCache *)0x0;
      info2.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
      info2.functionBody = (FunctionBody *)0x0;
      info2.prop = (RecyclableObject *)0x0;
      info2.propertyRecordUsageCache._0_4_ = 0xffffffff;
      info2.propertyRecordUsageCache._5_1_ = 1;
      PropertyValueInfo::SetCacheInfo
                ((PropertyValueInfo *)&info.inlineCacheIndex,local_80,local_70,local_4c,true);
      (*(pRVar10->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
        [0x17])(pRVar10,(ulong)(uint)propertyId,newValue,(ulong)local_34,&info.inlineCacheIndex);
      bVar6 = Phases::IsEnabled((Phases *)&DAT_01453738,InlineCachePhase);
      if ((bVar6) && (DAT_0145948a == '\x01')) {
        CacheOperators::TraceCache(local_70,L"PatchSetPropertyScoped",local_44,pSVar4,pRVar10);
      }
      bVar13 = local_34 != PropertyOperation_None;
      bVar6 = VarIsImpl<Js::JavascriptProxy>(pRVar10);
      if (bVar6 || bVar13) {
        return;
      }
      CacheOperators::CachePropertyWrite
                (pRVar10,false,local_88,local_44,(PropertyValueInfo *)&info.inlineCacheIndex,pSVar4)
      ;
      return;
    }
    index = local_68 + 1;
  }
  if (propertyId == 0x2d5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = local_40;
    *local_40 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xcb2,"(!isLexicalThisSlotSymbol)","!isLexicalThisSlotSymbol");
    if (!bVar6) goto LAB_009b7b93;
    *puVar5 = 0;
  }
  if ((int)local_78 != 0) {
    pvVar9 = FrameDisplay::GetItem(local_58,local_48);
    bVar6 = VarIs<Js::ConsoleScopeActivationObject>(pvVar9);
    if (bVar6) {
      if ((int)local_78 == 1) {
LAB_009b7b30:
        pvVar9 = FrameDisplay::GetItem(local_58,local_48);
        pRVar10 = VarTo<Js::RecyclableObject>(pvVar9);
        pPVar11 = ScriptContext::GetPropertyName(pSVar4,propertyId);
        Output::Trace(ConsoleScopePhase,L"Adding property \'%s\' to console scope object\n",
                      pPVar11 + 1);
        SetProperty(pRVar10,pRVar10,propertyId,newValue,pSVar4,propertyOperationFlags);
        return;
      }
      pvVar9 = FrameDisplay::GetItem(local_58,(int)local_78 - 2);
      bVar6 = VarIs<Js::GlobalObject>(pvVar9);
      if ((!bVar6) ||
         (instance = UnsafeVarTo<Js::GlobalObject>(pvVar9), instance == (GlobalObject *)0x0))
      goto LAB_009b7b30;
      info.inlineCacheIndex = 0;
      info.isFunctionPIC = false;
      info.allowResizingPolymorphicInlineCache = false;
      info._62_2_ = 0;
      DVar8 = GetRootSetter<int>((RecyclableObject *)instance,propertyId,
                                 (Var *)&info.inlineCacheIndex,(PropertyValueInfo *)local_120,pSVar4
                                );
      if ((DVar8 & Accessor) != None) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = local_40;
        *local_40 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0xcc0,"((flags & Accessor) != Accessor)",
                                    "(flags & Accessor) != Accessor");
        if (!bVar6) goto LAB_009b7b93;
        *puVar5 = 0;
      }
      if ((DVar8 & Proxy) != None) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = local_40;
        *local_40 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                    ,0xcc1,"((flags & Proxy) != Proxy)","(flags & Proxy) != Proxy");
        if (!bVar6) goto LAB_009b7b93;
        *puVar5 = 0;
      }
      if ((local_34 != PropertyOperation_None) || ((DVar8 & WritableData) != Data))
      goto LAB_009b7b30;
      if ((DVar8 & Const) != None) {
        JavascriptError::ThrowTypeError(pSVar4,-0x7ff5fbe1,(PCWSTR)0x0);
      }
      if (propertyId != 0x2d5) {
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = local_40;
      *local_40 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0xcca,"(!isLexicalThisSlotSymbol)","!isLexicalThisSlotSymbol");
      if (bVar6) {
        *puVar5 = 0;
        return;
      }
      goto LAB_009b7b93;
    }
  }
  bVar6 = TaggedNumber::Is(defaultInstance);
  if (bVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = local_40;
    *local_40 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xcd8,"(!TaggedNumber::Is(defaultInstance))",
                                "Root object is an int or tagged float?");
    if (!bVar6) goto LAB_009b7b93;
    *puVar5 = 0;
  }
  if (defaultInstance == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = local_40;
    *local_40 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xcd9,"(defaultInstance != nullptr)","defaultInstance != nullptr");
    if (!bVar6) {
LAB_009b7b93:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  pRVar10 = VarTo<Js::RecyclableObject>(defaultInstance);
  info.inlineCacheIndex = 0;
  info.isFunctionPIC = false;
  info.allowResizingPolymorphicInlineCache = false;
  info._62_2_ = 0;
  info2.m_instance = (RecyclableObject *)0x50000ffff;
  info2.m_propertyIndex = 0;
  info2.m_attributes = '\0';
  info2.flags = InlineCacheNoFlags;
  info2.cacheInfoFlag = 0;
  info2.inlineCache = (InlineCache *)0x0;
  info2.prop = (RecyclableObject *)0x0;
  info2.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  info2.functionBody = (FunctionBody *)0x0;
  info2.propertyRecordUsageCache._0_4_ = 0xffffffff;
  info2.propertyRecordUsageCache._5_1_ = 1;
  SetRootProperty(pRVar10,propertyId,newValue,(PropertyValueInfo *)&info.inlineCacheIndex,pSVar4,
                  propertyOperationFlags | PropertyOperation_Root);
  return;
}

Assistant:

inline void JavascriptOperators::PatchSetPropertyScoped(FunctionBody *const functionBody, TInlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, FrameDisplay *pDisplay, PropertyId propertyId, Var newValue, Var defaultInstance, PropertyOperationFlags propertyOperationFlags)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_PatchSetPropertyScoped);
        // Set the property using a scope stack rather than an individual instance.
        // Walk the stack until we find an instance that has the property and store
        // the new value there.

        ScriptContext *const scriptContext = functionBody->GetScriptContext();

        uint16 length = pDisplay->GetLength();
        RecyclableObject *object;

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);

        bool allowUndecInConsoleScope = (propertyOperationFlags & PropertyOperation_AllowUndeclInConsoleScope) == PropertyOperation_AllowUndeclInConsoleScope;
        bool isLexicalThisSlotSymbol = (propertyId == PropertyIds::_this);

        for (uint16 i = 0; i < length; i++)
        {
            object = UnsafeVarTo<RecyclableObject>(pDisplay->GetItem(i));

            AssertMsg(!VarIs<ConsoleScopeActivationObject>(object) || (i == length - 1), "Invalid location for ConsoleScopeActivationObject");

            Type* type = object->GetType();
            if (CacheOperators::TrySetProperty<true, true, true, true, true, !TInlineCache::IsPolymorphic, TInlineCache::IsPolymorphic, false>(
                    object, false, propertyId, newValue, scriptContext, propertyOperationFlags, nullptr, &info))
            {
                return;
            }

            // In scoped set property, we need to set the property when it is available; it could be a setter
            // or normal property. we need to check setter first, and if no setter is available, but HasProperty
            // is true, this must be a normal property.
            // TODO: merge OP_HasProperty and GetSetter in one pass if there is perf problem. In fastDOM we have quite
            // a lot of setters so separating the two might be actually faster.
            BOOL setAccessorResult = FALSE;
            if (SetAccessorOrNonWritableProperty(object, object, propertyId, newValue, &info, scriptContext, propertyOperationFlags, false, allowUndecInConsoleScope, &setAccessorResult))
            {
                return;
            }
            else if (!JavascriptOperators::IsObject(object))
            {
                JavascriptError::ThrowCantAssignIfStrictMode(propertyOperationFlags, scriptContext);
            }

            // Need to do a "get" of the current value (if any) to make sure that we're not writing to
            // let/const before declaration, but we need to disable implicit calls around the "get",
            // so we need to do a "has" first to make sure the "get" is valid (e.g., "get" on a HostDispatch
            // with implicit calls disabled will always "succeed").
            if (JavascriptOperators::HasProperty(object, propertyId))
            {
                DisableImplicitFlags disableImplicitFlags = scriptContext->GetThreadContext()->GetDisableImplicitFlags();
                scriptContext->GetThreadContext()->SetDisableImplicitFlags(DisableImplicitCallAndExceptionFlag);

                Var value;
                BOOL result = JavascriptOperators::GetProperty(object, propertyId, &value, scriptContext, nullptr);

                scriptContext->GetThreadContext()->SetDisableImplicitFlags(disableImplicitFlags);

                if (result && scriptContext->IsUndeclBlockVar(value) && !allowUndecInConsoleScope && !isLexicalThisSlotSymbol)
                {
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
                }

                PropertyValueInfo info2;
                PropertyValueInfo::SetCacheInfo(&info2, functionBody, inlineCache, inlineCacheIndex, !IsFromFullJit);
                PropertyOperationFlags setPropertyOpFlags = allowUndecInConsoleScope ? PropertyOperation_AllowUndeclInConsoleScope : PropertyOperation_None;
                object->SetProperty(propertyId, newValue, setPropertyOpFlags, &info2);

#if DBG_DUMP
                if (PHASE_VERBOSE_TRACE1(Js::InlineCachePhase))
                {
                    CacheOperators::TraceCache(inlineCache, _u("PatchSetPropertyScoped"), propertyId, scriptContext, object);
                }
#endif
                if (!VarIs<JavascriptProxy>(object) && !allowUndecInConsoleScope)
                {
                    CacheOperators::CachePropertyWrite(object, false, type, propertyId, &info2, scriptContext);
                }

                return;
            }
        }

        Assert(!isLexicalThisSlotSymbol);

        // If we have console scope and no one in the scope had the property add it to console scope
        if ((length > 0) && VarIs<ConsoleScopeActivationObject>(pDisplay->GetItem(length - 1)))
        {
            // CheckPrototypesForAccessorOrNonWritableProperty does not check for const in global object. We should check it here.
            if (length > 1)
            {
                Js::GlobalObject * globalObject = JavascriptOperators::TryFromVar<Js::GlobalObject>(pDisplay->GetItem(length - 2));
                if (globalObject)
                {
                    Var setterValue = nullptr;

                    DescriptorFlags flags = JavascriptOperators::GetRootSetter(globalObject, propertyId, &setterValue, &info, scriptContext);
                    Assert((flags & Accessor) != Accessor);
                    Assert((flags & Proxy) != Proxy);
                    if ((flags & Data) == Data && (flags & Writable) == None)
                    {
                        if (!allowUndecInConsoleScope)
                        {
                            if (flags & Const)
                            {
                                JavascriptError::ThrowTypeError(scriptContext, ERRAssignmentToConst);
                            }
                            Assert(!isLexicalThisSlotSymbol);
                            return;
                        }
                    }
                }
            }

            RecyclableObject* obj = VarTo<RecyclableObject>(pDisplay->GetItem(length - 1));
            OUTPUT_TRACE(Js::ConsoleScopePhase, _u("Adding property '%s' to console scope object\n"), scriptContext->GetPropertyName(propertyId)->GetBuffer());
            JavascriptOperators::SetProperty(obj, obj, propertyId, newValue, scriptContext, propertyOperationFlags);
            return;
        }

        // No one in the scope stack has the property, so add it to the default instance provided by the caller.
        AssertMsg(!TaggedNumber::Is(defaultInstance), "Root object is an int or tagged float?");
        Assert(defaultInstance != nullptr);
        RecyclableObject* obj = VarTo<RecyclableObject>(defaultInstance);
        {
            //SetPropertyScoped does not use inline cache for default instance
            PropertyValueInfo info2;
            JavascriptOperators::SetRootProperty(obj, propertyId, newValue, &info2, scriptContext, (PropertyOperationFlags)(propertyOperationFlags | PropertyOperation_Root));
        }
        JIT_HELPER_END(Op_PatchSetPropertyScoped);
    }